

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_mesh_tasks(CompilerMSL *this,SPIRBlock *block)

{
  string sStack_78;
  string local_58;
  string local_38;
  
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,this->builtin_task_grid_id);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&local_58,&this->super_CompilerGLSL,(block->mesh).groups[0].id,true);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&sStack_78,&this->super_CompilerGLSL,(block->mesh).groups[1].id,true);
  CompilerGLSL::to_unpacked_expression_abi_cxx11_
            (&local_38,&this->super_CompilerGLSL,(block->mesh).groups[2].id,true);
  CompilerGLSL::
  statement<char_const(&)[40],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [40])"spvMgp.set_threadgroups_per_grid(uint3(",
             &local_58,(char (*) [3])0x294843,&sStack_78,(char (*) [3])0x294843,&local_38,
             (char (*) [4])0x291e48);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x297f06);
  return;
}

Assistant:

void CompilerMSL::emit_mesh_tasks(SPIRBlock &block)
{
	// GLSL: Once this instruction is called, the workgroup must be terminated immediately, and the mesh shaders are launched.
	// TODO: find relieble and clean of terminating shader.
	flush_variable_declaration(builtin_task_grid_id);
	statement("spvMgp.set_threadgroups_per_grid(uint3(", to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ", to_unpacked_expression(block.mesh.groups[2]), "));");
	// This is correct if EmitMeshTasks is called in the entry function for shader.
	// Only viable solutions would be:
	// - Caller ensures the SPIR-V is inlined, then this always holds true.
	// - Pass down a "should terminate" bool to leaf functions and chain return (horrible and disgusting, let's not).
	statement("return;");
}